

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunSomeIndexTests.cpp
# Opt level: O0

int main(int ac,char **av)

{
  int iVar1;
  clock_t cVar2;
  clock_t cVar3;
  char *pcVar4;
  char *pcVar5;
  char **in_RSI;
  int in_EDI;
  bool bVar6;
  bool bVar7;
  int result;
  char *test_name;
  double time_taken;
  char *name;
  char *status_message;
  int status;
  clock_t t;
  int testToRun;
  char *arg;
  int run_all;
  int partial_match;
  int testNum;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  uint local_2c;
  char *local_28;
  uint local_18;
  uint local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_18 = 0;
  local_2c = 0xffffffff;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (in_EDI < 2) {
    printf("Available tests:\n");
    for (local_14 = 0; (int)local_14 < 3; local_14 = local_14 + 1) {
      printf("%3d. %s\n",(ulong)local_14,cmakeGeneratedFunctionMapEntries[(int)local_14].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(_stdout);
    iVar1 = __isoc99_scanf("%d",&local_18);
    if (iVar1 != 1) {
      printf("Couldn\'t parse that input as a number\n");
      return -1;
    }
    if (2 < (int)local_18) {
      printf("%3d is an invalid test number.\n",(ulong)local_18);
      return -1;
    }
    local_2c = local_18;
    local_8 = local_8 + -1;
    local_10 = local_10 + 1;
  }
  bVar6 = false;
  bVar7 = false;
  local_28 = (char *)0x0;
  if ((local_2c == 0xffffffff) && (1 < local_8)) {
    iVar1 = strcmp(local_10[1],"-R");
    bVar6 = iVar1 == 0;
    iVar1 = strcmp(local_10[1],"-A");
    bVar7 = iVar1 == 0;
  }
  if ((bVar6) && (local_8 < 3)) {
    printf("-R needs an additional parameter.\n");
    local_4 = -1;
  }
  else if (bVar7) {
    printf("TAP version 13\n");
    printf("1..%d\n",3);
    for (local_14 = 0; (int)local_14 < 3; local_14 = local_14 + 1) {
      pcVar5 = cmakeGeneratedFunctionMapEntries[(int)local_14].name;
      if ((local_8 < 3) ||
         (iVar1 = isTestSkipped(in_stack_ffffffffffffffa8,
                                (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                (char **)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98)), iVar1 != 1)) {
        cVar2 = clock();
        iVar1 = (*cmakeGeneratedFunctionMapEntries[(int)local_14].func)(local_8,local_10);
        cVar3 = clock();
        pcVar4 = "ok";
        if (iVar1 == -1) {
          pcVar4 = "not ok";
        }
        in_stack_ffffffffffffffa8 = (char *)((double)(cVar3 - cVar2) / 1000000.0);
        printf("%s %d %s # %f\n",in_stack_ffffffffffffffa8,pcVar4,(ulong)(local_14 + 1),pcVar5);
      }
      else {
        printf("ok %d %s # SKIP\n",(ulong)(local_14 + 1),pcVar5);
      }
    }
    printf("All tests finished.\n");
    local_4 = 0;
  }
  else {
    if (local_2c == 0xffffffff) {
      local_28 = lowercase(in_stack_ffffffffffffffa8);
    }
    for (local_14 = 0; (int)local_14 < 3 && local_2c == 0xffffffff; local_14 = local_14 + 1) {
      pcVar5 = lowercase(in_stack_ffffffffffffffa8);
      if ((bVar6) && (pcVar4 = strstr(pcVar5,local_28), pcVar4 != (char *)0x0)) {
        local_2c = local_14;
        local_8 = local_8 + -2;
        local_10 = local_10 + 2;
      }
      else if ((!bVar6) && (iVar1 = strcmp(pcVar5,local_28), iVar1 == 0)) {
        local_2c = local_14;
        local_8 = local_8 + -1;
        local_10 = local_10 + 1;
      }
      free(pcVar5);
    }
    free(local_28);
    if (local_2c == 0xffffffff) {
      printf("Available tests:\n");
      for (local_14 = 0; (int)local_14 < 3; local_14 = local_14 + 1) {
        printf("%3d. %s\n",(ulong)local_14,cmakeGeneratedFunctionMapEntries[(int)local_14].name);
      }
      printf("Failed: %s is an invalid test name.\n",local_10[1]);
      local_4 = -1;
    }
    else if (((int)local_2c < 0) || (2 < (int)local_2c)) {
      printf("testToRun was modified by TestDriver code to an invalid value: %3d.\n",(ulong)local_18
            );
      local_4 = -1;
    }
    else {
      local_4 = (*cmakeGeneratedFunctionMapEntries[(int)local_2c].func)(local_8,local_10);
    }
  }
  return local_4;
}

Assistant:

int main(int ac, char* av[])
{
  int i;
  int testNum = 0;
  int partial_match;
  int run_all;
  char *arg;
  int testToRun = -1;

  

  /* If no test name was given */
  /* process command line with user function.  */
  if (ac < 2) {
    /* Ask for a test.  */
    printf("Available tests:\n");
    for (i = 0; i < NumTests; ++i) {
      printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
    }
    printf("To run a test, enter the test number: ");
    fflush(stdout);
    if (scanf("%d", &testNum) != 1) {
      printf("Couldn't parse that input as a number\n");
      return -1;
    }
    if (testNum >= NumTests) {
      printf("%3d is an invalid test number.\n", testNum);
      return -1;
    }
    testToRun = testNum;
    ac--;
    av++;
  }
  partial_match = 0;
  run_all = 0;
  arg = CM_NULL; /* NOLINT */
  /* If partial match or running all tests are requested.  */
  if (testToRun == -1 && ac > 1) {
    partial_match = (strcmp(av[1], "-R") == 0) ? 1 : 0;
    run_all = (strcmp(av[1], "-A") == 0) ? 1 : 0;
  }
  if (partial_match != 0 && ac < 3) {
    printf("-R needs an additional parameter.\n");
    return -1;
  }
  if (run_all == 1) {
    clock_t t;
    int status = 0;
    const char* status_message = CM_NULL;
    printf("TAP version 13\n");
    printf("1..%d\n", NumTests);
    for (i = 0; i < NumTests; ++i) {
      const char *name = cmakeGeneratedFunctionMapEntries[i].name;
      if (ac > 2) {
        if (isTestSkipped(name, ac - 2, av + 2) == 1) {
          printf("ok %d %s # SKIP\n", i + 1, name);
          continue;
        }
      }
      t = clock();
      status = (*cmakeGeneratedFunctionMapEntries[i].func)(ac, av);
      t = clock() - t;
      status_message = (status == -1) ? "not ok" : "ok";
      {
        double time_taken = CM_CAST(double, t) / CLOCKS_PER_SEC;
        printf("%s %d %s # %f\n", status_message, i + 1, name, time_taken);
      }
    }
    printf("All tests finished.\n");

    return 0;
  }

  if (testToRun == -1) {
    arg = lowercase(av[1 + partial_match]);
  }
  for (i = 0; i < NumTests && testToRun == -1; ++i) {
    char *test_name = lowercase(cmakeGeneratedFunctionMapEntries[i].name);
    if (partial_match != 0 && strstr(test_name, arg) != CM_NULL) { /* NOLINT */
      testToRun = i;
      ac -= 2;
      av += 2;
    } else if (partial_match == 0 && strcmp(test_name, arg) == 0) {
      testToRun = i;
      ac--;
      av++;
    }
    free(test_name);
  }
  free(arg);
  if (testToRun != -1) {
    int result;

    if (testToRun < 0 || testToRun >= NumTests) {
      printf("testToRun was modified by TestDriver code to an invalid value: "
             "%3d.\n",
             testNum);
      return -1;
    }
    result = (*cmakeGeneratedFunctionMapEntries[testToRun].func)(ac, av);

    return result;
  }

  /* Nothing was run, display the test names.  */
  printf("Available tests:\n");
  for (i = 0; i < NumTests; ++i) {
    printf("%3d. %s\n", i, cmakeGeneratedFunctionMapEntries[i].name);
  }
  printf("Failed: %s is an invalid test name.\n", av[1]);

  return -1;
}